

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_graphics_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 uVar3;
  Ch *pCVar4;
  const_iterator cVar5;
  undefined4 *__s;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar6;
  iterator iVar7;
  Number NVar8;
  mapped_type *ppVVar9;
  long *in_FS_OFFSET;
  uint64_t render_pass;
  Hash hash;
  Hash local_48;
  Data local_40;
  
  pCVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(member);
  local_40.s.str = (Ch *)strtoull(pCVar4,(char **)0x0,0x10);
  cVar5 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->replayed_graphics_pipelines)._M_h,(key_type *)(local_40.ss.str + 8));
  if (cVar5.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>._M_cur
      != (__node_type *)0x0) {
    return true;
  }
  __s = (undefined4 *)ScratchAllocator::allocate_raw(&this->allocator,0x90,0x10);
  if (__s != (undefined4 *)0x0) {
    memset(__s,0,0x90);
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pipelines,member);
  *__s = 0x1c;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_001280e1:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  __s[4] = (pGVar6->data_).s.length;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"basePipelineIndex");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    __assert_fail("data_.f.flags & kIntFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x718,
                  "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  __s[0x22] = (pGVar6->data_).s.length;
  __s[4] = __s[4] & 0x7ffffc3f;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"basePipelineHandle");
  bVar2 = parse_derived_pipeline_handle
                    (this,iface,resolver,pGVar6,pipelines,RESOURCE_GRAPHICS_PIPELINE,
                     (VkPipeline *)(__s + 0x20));
  if (bVar2) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"layout");
    bVar2 = parse_pipeline_layout_handle(this,pGVar6,(VkPipelineLayout *)(__s + 0x1a));
    if (bVar2) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"renderPass");
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar6);
      local_48 = strtoull(pCVar4,(char **)0x0,0x10);
      if (local_48 != 0) {
        iVar7 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->replayed_render_passes)._M_h,&local_48);
        if (iVar7.super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
            return false;
          }
          bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                             ,"Render pass");
          if (!bVar2) {
            fprintf(_stderr,
                    "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                    ,"Render pass");
            return false;
          }
          return false;
        }
        if (*(long *)((long)iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>
                            ._M_cur + 0x10) == 0) {
          log_invalid_resource("Render pass",local_48);
          return false;
        }
        *(long *)(__s + 0x1c) =
             *(long *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>
                             ._M_cur + 0x10);
      }
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"subpass");
      if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        __s[0x1e] = (pGVar6->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,(Ch *)this_00);
        uVar1 = local_40.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar1 != NVar8.i64) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"stages");
          if ((pGVar6->data_).f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          __s[5] = (pGVar6->data_).s.length;
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"stages");
          bVar2 = parse_stages(this,iface,resolver,pGVar6,
                               (VkPipelineShaderStageCreateInfo **)(__s + 6));
          if (!bVar2) {
            return false;
          }
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,(Ch *)this_00);
        uVar1 = local_40.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar1 != NVar8.i64) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"rasterizationState");
          bVar2 = parse_rasterization_state
                            (this,pGVar6,(VkPipelineRasterizationStateCreateInfo **)(__s + 0x10));
          if (!bVar2) {
            return false;
          }
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,(Ch *)this_00);
        uVar1 = local_40.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (uVar1 != NVar8.i64) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"tessellationState");
          bVar2 = parse_tessellation_state
                            (this,pGVar6,(VkPipelineTessellationStateCreateInfo **)(__s + 0xc));
          if (!bVar2) {
            return false;
          }
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,(Ch *)this_00);
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)this_00);
        if (local_40.n.i64 != (Number)NVar8.i64) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"colorBlendState");
          bVar2 = parse_color_blend_state
                            (this,pGVar6,(VkPipelineColorBlendStateCreateInfo **)(__s + 0x16));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"depthStencilState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"depthStencilState");
          bVar2 = parse_depth_stencil_state
                            (this,pGVar6,(VkPipelineDepthStencilStateCreateInfo **)(__s + 0x14));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"dynamicState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"dynamicState");
          parse_dynamic_state(this,pGVar6,(VkPipelineDynamicStateCreateInfo **)(__s + 0x18));
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"viewportState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"viewportState");
          bVar2 = parse_viewport_state
                            (this,pGVar6,(VkPipelineViewportStateCreateInfo **)(__s + 0xe));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"multisampleState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"multisampleState");
          bVar2 = parse_multisample_state
                            (this,pGVar6,(VkPipelineMultisampleStateCreateInfo **)(__s + 0x12));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"inputAssemblyState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"inputAssemblyState");
          bVar2 = parse_input_assembly_state
                            (this,pGVar6,(VkPipelineInputAssemblyStateCreateInfo **)(__s + 10));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"vertexInputState");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"vertexInputState");
          bVar2 = parse_vertex_input_state
                            (this,pGVar6,(VkPipelineVertexInputStateCreateInfo **)(__s + 8));
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"pNext");
        if (bVar2) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_00,"pNext");
          bVar2 = parse_pnext_chain(this,pGVar6,(void **)(__s + 2),iface,resolver,pipelines);
          if (!bVar2) {
            return false;
          }
        }
        uVar1 = local_40.s.str;
        ppVVar9 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->replayed_graphics_pipelines,
                               (key_type *)(local_40.ss.str + 8));
        uVar3 = (**(code **)(*(long *)iface + 0x60))(iface,uVar1,__s,ppVVar9);
        return (bool)uVar3;
      }
      goto LAB_001280e1;
    }
  }
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_graphics_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_graphics_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkGraphicsPipelineCreateInfo>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_GRAPHICS_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	auto render_pass = string_to_uint64(obj["renderPass"].GetString());
	if (render_pass > 0)
	{
		auto rp_itr = replayed_render_passes.find(render_pass);
		if (rp_itr == end(replayed_render_passes))
		{
			log_missing_resource("Render pass", render_pass);
			return false;
		}
		else if (rp_itr->second == VK_NULL_HANDLE)
		{
			log_invalid_resource("Render pass", render_pass);
			return false;
		}
		else
			info.renderPass = rp_itr->second;
	}

	info.subpass = obj["subpass"].GetUint();

	if (obj.HasMember("stages"))
	{
		info.stageCount = obj["stages"].Size();
		if (!parse_stages(iface, resolver, obj["stages"], &info.pStages))
			return false;
	}

	if (obj.HasMember("rasterizationState"))
		if (!parse_rasterization_state(obj["rasterizationState"], &info.pRasterizationState))
			return false;

	if (obj.HasMember("tessellationState"))
		if (!parse_tessellation_state(obj["tessellationState"], &info.pTessellationState))
			return false;

	if (obj.HasMember("colorBlendState"))
		if (!parse_color_blend_state(obj["colorBlendState"], &info.pColorBlendState))
			return false;

	if (obj.HasMember("depthStencilState"))
		if (!parse_depth_stencil_state(obj["depthStencilState"], &info.pDepthStencilState))
			return false;

	if (obj.HasMember("dynamicState"))
		if (!parse_dynamic_state(obj["dynamicState"], &info.pDynamicState))
			return false;

	if (obj.HasMember("viewportState"))
		if (!parse_viewport_state(obj["viewportState"], &info.pViewportState))
			return false;

	if (obj.HasMember("multisampleState"))
		 if (!parse_multisample_state(obj["multisampleState"], &info.pMultisampleState))
		 	return false;

	if (obj.HasMember("inputAssemblyState"))
		if (!parse_input_assembly_state(obj["inputAssemblyState"], &info.pInputAssemblyState))
			return false;

	if (obj.HasMember("vertexInputState"))
		if (!parse_vertex_input_state(obj["vertexInputState"], &info.pVertexInputState))
			return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext, &iface, resolver, &pipelines))
			return false;

	if (!iface.enqueue_create_graphics_pipeline(hash, &info, &replayed_graphics_pipelines[hash]))
		return false;

	return true;
}